

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O0

QStringMatcher * __thiscall QStringMatcher::operator=(QStringMatcher *this,QStringMatcher *other)

{
  QStringMatcher *in_RSI;
  QStringMatcher *in_RDI;
  
  if (in_RDI != in_RSI) {
    QString::operator=((QString *)in_RSI,(QString *)in_RDI);
    in_RDI->q_cs = in_RSI->q_cs;
    (in_RDI->q_sv).m_size = (in_RSI->q_sv).m_size;
    (in_RDI->q_sv).m_data = (in_RSI->q_sv).m_data;
    memcpy(in_RDI->q_skiptable,in_RSI->q_skiptable,0x100);
  }
  return in_RDI;
}

Assistant:

QStringMatcher &QStringMatcher::operator=(const QStringMatcher &other)
{
    if (this != &other) {
        q_pattern = other.q_pattern;
        q_cs = other.q_cs;
        q_sv = other.q_sv;
        memcpy(q_skiptable, other.q_skiptable, sizeof(q_skiptable));
    }
    return *this;
}